

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall
XipFile::FileEntry::fromstream(FileEntry *this,XipFile *xip,allocmap *m,ReadWriter_ptr *r)

{
  uint32_t *puVar1;
  uint uVar2;
  element_type *peVar3;
  int iVar4;
  uint32_t size;
  undefined4 extraout_var;
  undefined8 *puVar5;
  pointer puVar6;
  uint uVar7;
  size_t __n;
  ByteVector filedata;
  ByteVector compressed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Alloc_hider local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined8 local_40;
  
  iVar4 = (*((r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_ReadWriter[6])();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_80,CONCAT44(extraout_var,iVar4),(allocator_type *)&stack0xffffffffffffffb0);
  peVar3 = (r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar3->_vptr_ReadWriter[2])
            (peVar3,local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
             (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_68,
             (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
             (allocator_type *)&stack0xffffffffffffffb0);
  __n = (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  uVar7 = (uint)__n;
  (this->super_XipEntry)._size = uVar7;
  if (__n == 0) {
    this->_compsize = uVar7;
  }
  else {
    memmove(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start,
            local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start,__n);
    this->_compsize = uVar7;
    uVar2 = (this->super_XipEntry)._size;
    if (uVar7 != 0 && uVar7 < uVar2) {
      puVar1 = &(this->super_XipEntry)._attr;
      *puVar1 = *puVar1 | 0x800;
      puVar6 = local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      goto LAB_001223a0;
    }
    __n = (size_t)uVar2;
  }
  this->_compsize = (uint32_t)__n;
  puVar6 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
LAB_001223a0:
  size = allocmap::findfree(m,((int)__n - 1U | 3) + 1);
  this->_rvaload = size;
  if (size != 0) {
    getrvareader((XipFile *)&stack0xffffffffffffffb0,(uint32_t)xip,size);
    (**(code **)(*(_func_int **)local_50._M_p + 0x18))(local_50._M_p,puVar6,this->_compsize);
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  XipEntry::name_abi_cxx11_((string *)&stack0xffffffffffffffb0,&this->super_XipEntry,xip);
  printf("error writing xip:%s - tried to alloc 0x%x bytes\n",local_50._M_p,(ulong)this->_compsize);
  if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
    operator_delete(local_50._M_p,(ulong)(local_40 + 1));
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "xip: could not alloc space for filedata";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

virtual void fromstream(XipFile& xip, allocmap& m, ReadWriter_ptr r)
        {
            ByteVector filedata(r->size());
            r->read(&filedata[0], filedata.size());
            ByteVector compressed(filedata.size());
            _size= filedata.size();
            _compsize= XipFile::compress(&filedata[0], filedata.size(), &compressed[0]);
            const uint8_t *pdata= &compressed[0];
            if (_compsize>=_size || _compsize==0) {
                _compsize= _size;
                pdata= &filedata[0];
            }
            else {
                _attr |= 0x800;   // compressed
            }
            _rvaload= m.findfree(roundsize(_compsize, 4));
            if (_rvaload==0) {
                printf("error writing xip:%s - tried to alloc 0x%x bytes\n", name(xip).c_str(), _compsize);
                throw "xip: could not alloc space for filedata";
            }
            xip.getrvareader(_rvaload, _compsize)->write(pdata, _compsize);
        }